

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O0

Gia_Man_t * Gia_ManDupCycled(Gia_Man_t *p,Abc_Cex_t *pCex,int nFrames)

{
  int iVar1;
  Vec_Bit_t *p_00;
  int *pInitState;
  Gia_Man_t *pGVar2;
  bool bVar3;
  undefined4 local_3c;
  Gia_Obj_t *pGStack_38;
  int i;
  Gia_Obj_t *pObj;
  Vec_Bit_t *vInits;
  Gia_Man_t *pNew;
  int nFrames_local;
  Abc_Cex_t *pCex_local;
  Gia_Man_t *p_local;
  
  Gia_ManCleanMark0(p);
  Gia_ManCycle(p,pCex,nFrames);
  iVar1 = Gia_ManRegNum(p);
  p_00 = Vec_BitAlloc(iVar1);
  local_3c = 0;
  while( true ) {
    iVar1 = Gia_ManRegNum(p);
    bVar3 = false;
    if (local_3c < iVar1) {
      iVar1 = Gia_ManPiNum(p);
      pGStack_38 = Gia_ManCi(p,iVar1 + local_3c);
      bVar3 = pGStack_38 != (Gia_Obj_t *)0x0;
    }
    if (!bVar3) break;
    Vec_BitPush(p_00,(uint)(*(ulong *)pGStack_38 >> 0x1e) & 1);
    local_3c = local_3c + 1;
  }
  pInitState = Vec_BitArray(p_00);
  pGVar2 = Gia_ManDupFlip(p,pInitState);
  Vec_BitFree(p_00);
  Gia_ManCleanMark0(p);
  return pGVar2;
}

Assistant:

Gia_Man_t * Gia_ManDupCycled( Gia_Man_t * p, Abc_Cex_t * pCex, int nFrames )
{
    Gia_Man_t * pNew;
    Vec_Bit_t * vInits;
    Gia_Obj_t * pObj;
    int i;
    Gia_ManCleanMark0(p);
    Gia_ManCycle( p, pCex, nFrames );
    vInits = Vec_BitAlloc( Gia_ManRegNum(p) );
    Gia_ManForEachRo( p, pObj, i )
        Vec_BitPush( vInits, pObj->fMark0 );
    pNew = Gia_ManDupFlip( p, Vec_BitArray(vInits) );
    Vec_BitFree( vInits );
    Gia_ManCleanMark0(p);
    return pNew;
}